

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<TxInUndoFormatter>::Ser<HashWriter,std::vector<Coin,std::allocator<Coin>>>
          (VectorFormatter<TxInUndoFormatter> *this,HashWriter *s,
          vector<Coin,_std::allocator<Coin>_> *v)

{
  long lVar1;
  pointer pCVar2;
  value_type *elem;
  pointer txout;
  long in_FS_OFFSET;
  TxInUndoFormatter formatter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<HashWriter>
            (s,((long)(v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0x30);
  pCVar2 = (v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (txout = (v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.super__Vector_impl_data.
               _M_start; txout != pCVar2; txout = txout + 1) {
    TxInUndoFormatter::Ser<HashWriter>(&formatter,s,txout);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }